

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O2

void __thiscall MicroTerm::MicroTerm(MicroTerm *this,char *t0,char *t1)

{
  Stream *pSVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__Hub_00104d40;
  std::__cxx11::string::string<std::allocator<char>>(local_38,t0,&local_39);
  pSVar1 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s0 = pSVar1;
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_38,t1,&local_39);
  pSVar1 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s1 = pSVar1;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

MicroTerm(const char* t0, const char* t1)
	{
		s0 = connect(t0);
		s1 = connect(t1);
	}